

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

float ncnn::float16_to_float32(unsigned_short value)

{
  short sVar1;
  int iVar2;
  int iVar3;
  anon_union_4_2_947300b0 tmp;
  unsigned_short significand;
  unsigned_short exponent;
  unsigned_short sign;
  unsigned_short value_local;
  
  iVar2 = (int)(value & 0x8000) >> 0xf;
  iVar3 = (int)(value & 0x7c00) >> 10;
  sVar1 = (short)iVar3;
  significand = value & 0x3ff;
  if (sVar1 == 0) {
    if (significand == 0) {
      tmp.u = iVar2 << 0x1f;
    }
    else {
      exponent = 0;
      for (; (significand & 0x200) == 0; significand = significand << 1) {
        exponent = exponent + 1;
      }
      tmp.u = iVar2 << 0x1f | (0x70 - (uint)exponent) * 0x800000 |
              (uint)(ushort)((significand & 0x1ff) << 1) << 0xd;
    }
  }
  else if (sVar1 == 0x1f) {
    tmp.u = iVar2 << 0x1f | 0x7f800000U | (uint)significand << 0xd;
  }
  else {
    tmp.u = iVar2 << 0x1f | (iVar3 + 0x70) * 0x800000 | (uint)significand << 0xd;
  }
  return (float)tmp.u;
}

Assistant:

float float16_to_float32(unsigned short value)
{
    // 1 : 5 : 10
    unsigned short sign = (value & 0x8000) >> 15;
    unsigned short exponent = (value & 0x7c00) >> 10;
    unsigned short significand = value & 0x03FF;

    //     NCNN_LOGE("%d %d %d", sign, exponent, significand);

    // 1 : 8 : 23
    union
    {
        unsigned int u;
        float f;
    } tmp;
    if (exponent == 0)
    {
        if (significand == 0)
        {
            // zero
            tmp.u = (sign << 31);
        }
        else
        {
            // denormal
            exponent = 0;
            // find non-zero bit
            while ((significand & 0x200) == 0)
            {
                significand <<= 1;
                exponent++;
            }
            significand <<= 1;
            significand &= 0x3FF;
            tmp.u = (sign << 31) | ((-exponent + (-15 + 127)) << 23) | (significand << 13);
        }
    }
    else if (exponent == 0x1F)
    {
        // infinity or NaN
        tmp.u = (sign << 31) | (0xFF << 23) | (significand << 13);
    }
    else
    {
        // normalized
        tmp.u = (sign << 31) | ((exponent + (-15 + 127)) << 23) | (significand << 13);
    }

    return tmp.f;
}